

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

int instadisintegrate(char *str)

{
  uint uVar1;
  
  if (u.uprops[4].intrinsic == 0 && u.uprops[4].extrinsic == 0) {
    if (((byte)youmonst.mintrinsics & 8) != 0) {
      return 0;
    }
  }
  else {
    if ((u.uprops[4].intrinsic >> 0x1a & 1) == 0) {
      return 0;
    }
    if ((u.uprops[4].intrinsic & 0xfbffffff) != 0 || u.uprops[4].extrinsic != 0) {
      return 0;
    }
    if (((byte)youmonst.mintrinsics & 8) != 0) {
      return 0;
    }
    uVar1 = mt_random();
    if (uVar1 % 10 != 0) {
      return 0;
    }
  }
  uVar1 = mt_random();
  if (uVar1 % 10 == 0) {
    return 0;
  }
  pline("You disintegrate!");
  if ((youmonst.data)->cwt < 0x65) {
    uVar1 = 1;
  }
  else {
    uVar1 = (uint)((youmonst.data)->cwt / 100);
  }
  uVar1 = rnd(uVar1);
  if (5 < uVar1) {
    uVar1 = 6;
  }
  killer_format = 1;
  u.ugrave_arise = -3;
  killer = str;
  done(0xb);
  return uVar1;
}

Assistant:

int instadisintegrate(const char *str)
{
	int result;
	if (FDisint_resistance || (PDisint_resistance && rn2(10)) || !rn2(10))
	    return 0;
	pline("You disintegrate!");
	result = youmonst.data->cwt;
	weight_dmg(result);
	result = min(6, result);
	killer_format = KILLED_BY;
	killer = str;
	u.ugrave_arise = -3;
	done(DISINTEGRATED);

	return result;
}